

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  TestEnum_9c8e9318b29d9cd3 TVar1;
  TestEnum_9c8e9318b29d9cd3 TVar2;
  uint uVar3;
  Reader *this_00;
  Exception *pEVar4;
  uint i;
  long lVar5;
  StringPtr name;
  StringPtr name_00;
  initializer_list<capnp::DynamicValue::Reader> value;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Fault f_1;
  undefined1 local_294 [4];
  Fault f;
  unsigned_long local_268;
  ListElementCount local_25c;
  BuilderFor<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_> typed;
  Reader local_210;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  _kjCondition;
  ListElementCount local_1a0;
  Builder root;
  Builder local_160;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,(StructSchema)0x655118);
  typed.builder.segment = (SegmentBuilder *)CONCAT44(typed.builder.segment._4_4_,9);
  typed.builder.capTable = (CapTableBuilder *)(schemas::s_9c8e9318b29d9cd3 + 0x48);
  typed.builder.ptr = (byte *)CONCAT62(typed.builder.ptr._2_6_,2);
  name.content.size_ = 10;
  name.content.ptr = "enumField";
  DynamicStruct::Builder::set(&root,name,(Reader *)&typed);
  DynamicValue::Reader::~Reader((Reader *)&typed);
  local_210.type = ENUM;
  typed.builder.segment = (SegmentBuilder *)CONCAT44(typed.builder.segment._4_4_,9);
  typed.builder.capTable = (CapTableBuilder *)(schemas::s_9c8e9318b29d9cd3 + 0x48);
  typed.builder.ptr = (byte *)CONCAT62(typed.builder.ptr._2_6_,1);
  local_210.field_1.floatValue = 3.28046940758054e-317;
  local_210.field_1.enumValue.value = 0;
  name_00.content.size_ = 9;
  name_00.content.ptr = "enumList";
  value._M_len = 2;
  value._M_array = (iterator)&typed;
  DynamicStruct::Builder::set(&root,name_00,value);
  this_00 = &local_210;
  lVar5 = 0;
  do {
    DynamicValue::Reader::~Reader(this_00);
    lVar5 = lVar5 + 0x48;
    this_00 = this_00 + -1;
  } while (lVar5 != 0x90);
  name_01.content.size_ = 10;
  name_01.content.ptr = "enumField";
  DynamicStruct::Builder::get((Builder *)&typed,&root,name_01);
  _kjCondition.right =
       DynamicValue::Builder::AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>::
       apply((Builder *)&typed);
  _kjCondition.result = _kjCondition.right == BAZ;
  _kjCondition.left = BAZ;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&typed);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    f.exception._0_2_ = 2;
    name_02.content.size_ = 10;
    name_02.content.ptr = "enumField";
    DynamicStruct::Builder::get((Builder *)&typed,&root,name_02);
    TVar1 = DynamicValue::Builder::AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>
            ::apply((Builder *)&typed);
    f_1.exception._0_2_ = TVar1;
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(TestEnum::BAZ) == (root.get(\\\"enumField\\\").as<TestEnum>())\", _kjCondition, TestEnum::BAZ, root.get(\"enumField\").as<TestEnum>()"
               ,(char (*) [75])
                "failed: expected (TestEnum::BAZ) == (root.get(\"enumField\").as<TestEnum>())",
               &_kjCondition,(TestEnum_9c8e9318b29d9cd3 *)&f,(TestEnum_9c8e9318b29d9cd3 *)&f_1);
    DynamicValue::Builder::~Builder((Builder *)&typed);
  }
  name_03.content.size_ = 9;
  name_03.content.ptr = "enumList";
  DynamicStruct::Builder::get(&local_160,&root,name_03);
  local_294 = (undefined1  [4])0x1;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&_kjCondition,&local_160);
  typed.builder.segment = (SegmentBuilder *)0x2;
  typed.builder.capTable = (CapTableBuilder *)CONCAT44(typed.builder.capTable._4_4_,local_1a0);
  typed.builder.ptr = " == ";
  typed.builder.elementCount = 5;
  typed.builder.step = 0;
  typed.builder.structDataSize._0_1_ = local_1a0 == 2;
  if (!(bool)(undefined1)typed.builder.structDataSize) {
    f_1.exception = (Exception *)0x2;
    local_268 = CONCAT44(local_268._4_4_,local_1a0);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x23,FAILED,"(expected.size()) == (list.size())",
               "_kjCondition,expected.size(), list.size()",
               (DebugComparison<unsigned_long,_unsigned_int> *)&typed,(unsigned_long *)&f_1,
               (uint *)&local_268);
    kj::_::Debug::Fault::fatal(&f);
  }
  pEVar4 = (Exception *)local_294;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    DynamicList::Builder::operator[]((Builder *)&typed,(Builder *)&_kjCondition,(uint)lVar5);
    TVar2 = DynamicValue::Builder::AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>
            ::apply((Builder *)&typed);
    TVar1 = *(TestEnum_9c8e9318b29d9cd3 *)&(pEVar4->ownFile).content.ptr;
    f.exception = pEVar4;
    DynamicValue::Builder::~Builder((Builder *)&typed);
    if ((TVar1 != TVar2) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&typed,(Builder *)&_kjCondition,(uint)lVar5);
      TVar1 = DynamicValue::Builder::
              AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>::apply
                        ((Builder *)&typed);
      f_1.exception._0_2_ = TVar1;
      kj::_::Debug::
      log<char_const(&)[75],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x25,ERROR,
                 "\"failed: expected \" \"(expected.begin()[i]) == (list[i].template as<Element>())\", _kjCondition, expected.begin()[i], list[i].template as<Element>()"
                 ,(char (*) [75])
                  "failed: expected (expected.begin()[i]) == (list[i].template as<Element>())",
                 (DebugComparison<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3_&,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)&f,(TestEnum_9c8e9318b29d9cd3 *)pEVar4,(TestEnum_9c8e9318b29d9cd3 *)&f_1);
      DynamicValue::Builder::~Builder((Builder *)&typed);
    }
    pEVar4 = (Exception *)((long)&(pEVar4->ownFile).content.ptr + 2);
  }
  DynamicValue::Builder::
  AsImpl<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_(capnp::Kind)6>::
  apply(&typed,&local_160);
  f.exception = (Exception *)0x2;
  if (typed.builder.elementCount == 2) {
    pEVar4 = (Exception *)local_294;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      uVar3 = typed.builder.step * (int)lVar5 >> 3;
      f.exception = pEVar4;
      if ((*(short *)&(pEVar4->ownFile).content.ptr != *(short *)(typed.builder.ptr + uVar3)) &&
         (kj::_::Debug::minSeverity < 3)) {
        f_1.exception._0_2_ = *(undefined2 *)(typed.builder.ptr + uVar3);
        kj::_::Debug::
        log<char_const(&)[53],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x2b,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (typed[i])\", _kjCondition, expected.begin()[i], typed[i]"
                   ,(char (*) [53])"failed: expected (expected.begin()[i]) == (typed[i])",
                   (DebugComparison<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3_&,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                    *)&f,(TestEnum_9c8e9318b29d9cd3 *)pEVar4,(TestEnum_9c8e9318b29d9cd3 *)&f_1);
      }
      pEVar4 = (Exception *)((long)&(pEVar4->ownFile).content.ptr + 2);
    }
    DynamicValue::Builder::~Builder(&local_160);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_268 = 2;
  local_25c = typed.builder.elementCount;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x29,FAILED,"(expected.size()) == (typed.size())",
             "_kjCondition,expected.size(), typed.size()",
             (DebugComparison<unsigned_long,_unsigned_int> *)&f,&local_268,&local_25c);
  kj::_::Debug::Fault::fatal(&f_1);
}

Assistant:

TEST(DynamicApi, SetEnumFromNative) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  root.set("enumField", TestEnum::BAZ);
  root.set("enumList", {TestEnum::BAR, TestEnum::FOO});
  EXPECT_EQ(TestEnum::BAZ, root.get("enumField").as<TestEnum>());
  checkList<TestEnum>(root.get("enumList"), {TestEnum::BAR, TestEnum::FOO});
}